

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O0

uint64_t helper_iwmmxt_madduq_aarch64(uint64_t a,uint64_t b)

{
  uint64_t b_local;
  uint64_t a_local;
  
  return (a & 0xffff) * (b & 0xffff) + (a >> 0x10 & 0xffff) * (b >> 0x10 & 0xffff) & 0xffffffff |
         (a >> 0x20 & 0xffff) * (b >> 0x20 & 0xffff) + (a >> 0x30) * (b >> 0x30) << 0x20;
}

Assistant:

uint64_t HELPER(iwmmxt_madduq)(uint64_t a, uint64_t b)
{
    a = ((
            ((a >> 0) & 0xffff) * ((b >> 0) & 0xffff) +
            ((a >> 16) & 0xffff) * ((b >> 16) & 0xffff)
        ) & 0xffffffff) | ((
            ((a >> 32) & 0xffff) * ((b >> 32) & 0xffff) +
            ((a >> 48) & 0xffff) * ((b >> 48) & 0xffff)
        ) << 32);
    return a;
}